

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall ON_Material::Dump(ON_Material *this,ON_TextLog *dump)

{
  ON_Texture *pOVar1;
  ulong uVar2;
  long lVar3;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  ON_TextLog::Print(dump,"ambient rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_ambient);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"diffuse rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_diffuse);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"emmisive rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_emission);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"specular rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_specular);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"reflection rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_reflection);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"transparent rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_transparent);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"shine = %g%%\n",(this->m_shine * 100.0) / 255.0);
  ON_TextLog::Print(dump,"transparency = %g%%\n",this->m_transparency * 100.0);
  ON_TextLog::Print(dump,"reflectivity = %g%%\n",this->m_reflectivity * 100.0);
  ON_TextLog::Print(dump,"index of refraction = %g\n",this->m_index_of_refraction);
  ON_TextLog::Print(dump,"plug-in id = ");
  ON_TextLog::Print(dump,&this->m_plugin_id);
  ON_TextLog::Print(dump,"\n");
  lVar3 = 0;
  for (uVar2 = 0; (long)uVar2 < (long)(this->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
      uVar2 = uVar2 + 1) {
    ON_TextLog::Print(dump,"texture[%d]:\n",uVar2 & 0xffffffff);
    ON_TextLog::PushIndent(dump);
    pOVar1 = (this->m_textures).super_ON_ClassArray<ON_Texture>.m_a;
    (**(code **)(*(long *)((long)&((ON_Texture *)
                                  (&((ON_Texture *)
                                    (&((ON_Texture *)(&pOVar1->m_texture_id + -1))->m_texture_id +
                                    -1))->m_texture_id + -1))->m_texture_id +
                          lVar3 + 0xfffffffffffffff0U) + 0x38))
              ((long)&((ON_Texture *)
                      (&((ON_Texture *)
                        (&((ON_Texture *)(&pOVar1->m_texture_id + -1))->m_texture_id + -1))->
                        m_texture_id + -1))->m_texture_id + lVar3 + 0xfffffffffffffff0U,dump);
    ON_TextLog::PopIndent(dump);
    lVar3 = lVar3 + 0x200;
  }
  return;
}

Assistant:

void
ON_Material::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);

  dump.Print("ambient rgb = "); dump.PrintRGB( m_ambient ); dump.Print("\n");
  dump.Print("diffuse rgb = "); dump.PrintRGB( m_diffuse ); dump.Print("\n");
  dump.Print("emmisive rgb = "); dump.PrintRGB( m_emission ); dump.Print("\n");
  dump.Print("specular rgb = "); dump.PrintRGB( m_specular ); dump.Print("\n");
  dump.Print("reflection rgb = "); dump.PrintRGB( m_reflection ); dump.Print("\n");
  dump.Print("transparent rgb = "); dump.PrintRGB( m_transparent ); dump.Print("\n");
  dump.Print("shine = %g%%\n",100.0*m_shine/ON_Material::MaxShine );
  dump.Print("transparency = %g%%\n",100.0*m_transparency);
  dump.Print("reflectivity = %g%%\n",100.0*m_reflectivity);
  dump.Print("index of refraction = %g\n",m_index_of_refraction);

  dump.Print("plug-in id = "); dump.Print(m_plugin_id); dump.Print("\n");
  int i;
  for( i = 0; i < m_textures.Count(); i++ )
  {
    dump.Print("texture[%d]:\n",i);
    dump.PushIndent();
    m_textures[i].Dump(dump);
    dump.PopIndent();
  }
}